

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::GoogleOnceDynamic*,std::allocator<google::protobuf::GoogleOnceDynamic*>>>
               (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                *container)

{
  pointer ppGVar1;
  
  if (container !=
      (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
       *)0x0) {
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::GoogleOnceDynamic**,std::vector<google::protobuf::GoogleOnceDynamic*,std::allocator<google::protobuf::GoogleOnceDynamic*>>>>
              ((__normal_iterator<google::protobuf::GoogleOnceDynamic_**,_std::vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<google::protobuf::GoogleOnceDynamic_**,_std::vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    ppGVar1 = (container->
              super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppGVar1) {
      (container->
      super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppGVar1;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}